

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O1

void __thiscall asmjit::v1_14::a64::ARMRAPass::onInit(ARMRAPass *this)

{
  RARegCount *pRVar1;
  RARegMask *pRVar2;
  Arch AVar3;
  byte bVar4;
  uint32_t uVar5;
  BaseBuilder *pBVar6;
  BaseReg *pBVar7;
  uint uVar8;
  
  pBVar6 = (this->super_BaseRAPass).super_FuncPass.super_Pass._cb;
  AVar3 = (pBVar6->super_BaseEmitter)._environment._arch;
  (this->_emitHelper).super_BaseEmitHelper._emitter = &pBVar6->super_BaseEmitter;
  (this->super_BaseRAPass)._archTraits = (ArchTraits *)(_archTraits + (ulong)AVar3 * 0xd8);
  (this->super_BaseRAPass)._physRegCount.field_0._packed = 0x2020;
  bVar4 = (this->super_BaseRAPass)._physRegCount.field_0._regs[1];
  if (bVar4 < 0xe0) {
    uVar8 = (uint)(this->super_BaseRAPass)._physRegCount.field_0._regs[2] + (uint)bVar4 + 0x20;
    if (uVar8 < 0x100) {
      (this->super_BaseRAPass)._physRegIndex.super_RARegCount.field_0._packed =
           (bVar4 + 0x20) * 0x10000 + uVar8 * 0x1000000 + 0x2000;
      (this->super_BaseRAPass)._physRegTotal =
           (uint)(this->super_BaseRAPass)._physRegCount.field_0._regs[3] +
           (uint)(this->super_BaseRAPass)._physRegIndex.super_RARegCount.field_0._regs[3];
      uVar5 = (this->super_BaseRAPass)._physRegCount.field_0._packed;
      (this->super_BaseRAPass)._availableRegCount.field_0._packed = uVar5;
      uVar8 = ~(uint)(-1L << ((byte)uVar5 & 0x3f));
      (this->super_BaseRAPass)._availableRegs._masks._data[0] = uVar8;
      (this->super_BaseRAPass)._availableRegs._masks._data[1] =
           ~(uint)(-1L << ((byte)(uVar5 >> 8) & 0x3f));
      (this->super_BaseRAPass)._availableRegs._masks._data[2] =
           ~(uint)(-1L << ((byte)(uVar5 >> 0x10) & 0x3f));
      (this->super_BaseRAPass)._availableRegs._masks._data[3] =
           ~(uint)(-1L << ((byte)(uVar5 >> 0x18) & 0x3f));
      *(undefined2 *)(this->super_BaseRAPass)._scratchRegIndexes._data = 0x1c1b;
      if ((((((this->super_BaseRAPass)._func)->_frame)._attributes & kHasPreservedFP) !=
           kNoAttributes) || ((pBVar6->super_BaseEmitter)._environment._platformABI == kDarwin)) {
        (this->super_BaseRAPass)._availableRegs._masks._data[0] = uVar8 & 0xdfffffff;
        pRVar1 = &(this->super_BaseRAPass)._availableRegCount;
        (pRVar1->field_0)._regs[0] = (pRVar1->field_0)._regs[0] + 0xff;
      }
      pRVar2 = &(this->super_BaseRAPass)._availableRegs;
      (pRVar2->_masks)._data[0] = (pRVar2->_masks)._data[0] & 0x7ffbffff;
      pRVar1 = &(this->super_BaseRAPass)._availableRegCount;
      (pRVar1->field_0)._regs[0] = (pRVar1->field_0)._regs[0] + 0xfe;
      (this->super_BaseRAPass)._sp.super_Operand.super_Operand_._signature = 0x8000039;
      (this->super_BaseRAPass)._sp.super_Operand.super_Operand_._baseId = 0x1f;
      pBVar7 = &(this->super_BaseRAPass)._sp;
      (pBVar7->super_Operand).super_Operand_._data[0] = 0;
      (pBVar7->super_Operand).super_Operand_._data[1] = 0;
      (this->super_BaseRAPass)._fp.super_Operand.super_Operand_._signature = 0x8000039;
      (this->super_BaseRAPass)._fp.super_Operand.super_Operand_._baseId = 0x1d;
      pBVar7 = &(this->super_BaseRAPass)._fp;
      (pBVar7->super_Operand).super_Operand_._data[0] = 0;
      (pBVar7->super_Operand).super_Operand_._data[1] = 0;
      return;
    }
  }
  else {
    onInit();
  }
  onInit();
  return;
}

Assistant:

void ARMRAPass::onInit() noexcept {
  Arch arch = cc()->arch();

  _emitHelper._emitter = _cb;

  _archTraits = &ArchTraits::byArch(arch);
  _physRegCount.set(RegGroup::kGp, 32);
  _physRegCount.set(RegGroup::kVec, 32);
  _physRegCount.set(RegGroup::kMask, 0);
  _physRegCount.set(RegGroup::kExtraVirt3, 0);
  _buildPhysIndex();

  _availableRegCount = _physRegCount;
  _availableRegs[RegGroup::kGp] = Support::lsbMask<uint32_t>(_physRegCount.get(RegGroup::kGp));
  _availableRegs[RegGroup::kVec] = Support::lsbMask<uint32_t>(_physRegCount.get(RegGroup::kVec));
  _availableRegs[RegGroup::kMask] = Support::lsbMask<uint32_t>(_physRegCount.get(RegGroup::kMask));
  _availableRegs[RegGroup::kExtraVirt3] = Support::lsbMask<uint32_t>(_physRegCount.get(RegGroup::kExtraVirt3));

  _scratchRegIndexes[0] = uint8_t(27);
  _scratchRegIndexes[1] = uint8_t(28);

  // The architecture specific setup makes implicitly all registers available. So
  // make unavailable all registers that are special and cannot be used in general.
  bool hasFP = _func->frame().hasPreservedFP();

  // Apple ABI requires that the frame-pointer register is not changed by leaf functions and properly updated
  // by non-leaf functions. So, let's make this register unavailable as it's just not safe to update it.
  if (hasFP || cc()->environment().isDarwin())
    makeUnavailable(RegGroup::kGp, Gp::kIdFp);

  makeUnavailable(RegGroup::kGp, Gp::kIdSp);
  makeUnavailable(RegGroup::kGp, Gp::kIdOs); // OS-specific use, usually TLS.

  _sp = sp;
  _fp = x29;
}